

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WAsmjsUtils.cpp
# Opt level: O0

RegisterSpace * __thiscall
WAsmJs::TypedRegisterAllocator::GetRegisterSpace(TypedRegisterAllocator *this,Types type)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Types type_local;
  TypedRegisterAllocator *this_local;
  
  bVar2 = IsValidType(this,type);
  if (!bVar2) {
    Js::Throw::InternalError();
  }
  bVar2 = IsTypeExcluded(this,type);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/WAsmjsUtils.cpp"
                       ,0x19e,"(!IsTypeExcluded(type))","!IsTypeExcluded(type)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return this->mTypeSpaces[type];
}

Assistant:

RegisterSpace* TypedRegisterAllocator::GetRegisterSpace(Types type) const
    {
        if (!IsValidType(type))
        {
            Assert("Invalid type for RegisterSpace in TypedMemoryStructure");
            Js::Throw::InternalError();
        }
        Assert(!IsTypeExcluded(type));
        return mTypeSpaces[type];
    }